

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O2

void __thiscall
cmCPackIFWRepository::WriteRepositoryConfig(cmCPackIFWRepository *this,cmXMLWriter *xout)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"Repository",&local_31);
  cmXMLWriter::StartElement(xout,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"Url",&local_31);
  cmXMLWriter::Element<std::__cxx11::string>(xout,&local_30,&this->Url);
  std::__cxx11::string::~string((string *)&local_30);
  if ((this->Enabled)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_30,"Enabled",&local_31);
    cmXMLWriter::Element<std::__cxx11::string>(xout,&local_30,&this->Enabled);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if ((this->Username)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_30,"Username",&local_31);
    cmXMLWriter::Element<std::__cxx11::string>(xout,&local_30,&this->Username);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if ((this->Password)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_30,"Password",&local_31);
    cmXMLWriter::Element<std::__cxx11::string>(xout,&local_30,&this->Password);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if ((this->DisplayName)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_30,"DisplayName",&local_31);
    cmXMLWriter::Element<std::__cxx11::string>(xout,&local_30,&this->DisplayName);
    std::__cxx11::string::~string((string *)&local_30);
  }
  cmXMLWriter::EndElement(xout);
  return;
}

Assistant:

void cmCPackIFWRepository::WriteRepositoryConfig(cmXMLWriter& xout)
{
  xout.StartElement("Repository");

  // Url
  xout.Element("Url", this->Url);
  // Enabled
  if (!this->Enabled.empty()) {
    xout.Element("Enabled", this->Enabled);
  }
  // Username
  if (!this->Username.empty()) {
    xout.Element("Username", this->Username);
  }
  // Password
  if (!this->Password.empty()) {
    xout.Element("Password", this->Password);
  }
  // DisplayName
  if (!this->DisplayName.empty()) {
    xout.Element("DisplayName", this->DisplayName);
  }

  xout.EndElement();
}